

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMatcher.h
# Opt level: O0

Order * __thiscall OrderMatcher::find(OrderMatcher *this,string *symbol,Side side,string *id)

{
  bool bVar1;
  exception *this_00;
  pointer ppVar2;
  Order *pOVar3;
  string local_58;
  _Self local_38;
  _Self local_30;
  iterator i;
  string *id_local;
  Side side_local;
  string *symbol_local;
  OrderMatcher *this_local;
  
  i._M_node = (_Base_ptr)id;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
       ::find(&this->m_markets,symbol);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
       ::end(&this->m_markets);
  bVar1 = std::operator==(&local_30,&local_38);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>
             ::operator->(&local_30);
    std::__cxx11::string::string((string *)&local_58,(string *)id);
    pOVar3 = Market::find(&ppVar2->second,side,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    return pOVar3;
  }
  this_00 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this_00);
  __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

Order &find(std::string symbol, Order::Side side, std::string id) {
    Markets::iterator i = m_markets.find(symbol);
    if (i == m_markets.end()) {
      throw std::exception();
    }
    return i->second.find(side, id);
  }